

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::Struct::_InternalSerialize
          (Struct *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  UntypedMapBase *pUVar3;
  size_type sVar4;
  WireFormatLite *pWVar5;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view field_name;
  string_view field_name_00;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  reference local_c8;
  value_type *entry_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  *__range4_1;
  char *local_80;
  reference local_78;
  value_type *entry;
  const_iterator __end4;
  MapSorterIt<const_void_*> local_58;
  const_iterator __begin4;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
  *__range4;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  *field;
  uint32_t cached_has_bits;
  Struct *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Struct *this_local;
  
  pUVar3 = (UntypedMapBase *)_internal_fields_abi_cxx11_(this);
  bVar1 = internal::UntypedMapBase::empty(pUVar3);
  stream_local = (EpsCopyOutputStream *)target;
  if (!bVar1) {
    pUVar3 = (UntypedMapBase *)_internal_fields_abi_cxx11_(this);
    bVar1 = protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if ((bVar1) && (sVar4 = internal::UntypedMapBase::size(pUVar3), 1 < sVar4)) {
      internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
      ::MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                      *)&__begin4,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                      *)pUVar3);
      local_58.ptr = (void **)internal::
                              MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                              ::begin((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                                       *)&__begin4);
      entry = (value_type *)
              internal::
              MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
              ::end((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                     *)&__begin4);
      while (bVar1 = internal::MapSorterIt<const_void_*>::operator!=
                               (&local_58,(MapSorterIt<const_void_*> *)&entry), bVar1) {
        local_78 = internal::
                   MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                   ::const_iterator::operator*((const_iterator *)&local_58);
        stream_local = (EpsCopyOutputStream *)
                       internal::
                       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                       ::InternalSerialize(1,&local_78->first,&local_78->second,
                                           (uint8_t *)stream_local,stream);
        pWVar5 = (WireFormatLite *)std::__cxx11::string::data();
        uVar2 = std::__cxx11::string::length();
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&__range4_1,
                   "google.protobuf.Struct.fields");
        field_name._M_str = in_R9;
        field_name._M_len = (size_t)local_80;
        internal::WireFormatLite::VerifyUtf8String
                  (pWVar5,(char *)(ulong)uVar2,1,(Operation)__range4_1,field_name);
        internal::MapSorterIt<const_void_*>::operator++(&local_58);
      }
      internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
      ::~MapSorterPtr((MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                       *)&__begin4);
    }
    else {
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::begin((const_iterator *)&__end4_1.super_UntypedMapIterator.bucket_index_,
              (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
               *)pUVar3);
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::end((const_iterator *)&entry_1,
            (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
             *)pUVar3);
      while (bVar1 = protobuf::operator!=
                               ((const_iterator *)&__end4_1.super_UntypedMapIterator.bucket_index_,
                                (const_iterator *)&entry_1), bVar1) {
        local_c8 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                   ::const_iterator::operator*
                             ((const_iterator *)&__end4_1.super_UntypedMapIterator.bucket_index_);
        stream_local = (EpsCopyOutputStream *)
                       internal::
                       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                       ::InternalSerialize(1,&local_c8->first,&local_c8->second,
                                           (uint8_t *)stream_local,stream);
        pWVar5 = (WireFormatLite *)std::__cxx11::string::data();
        uVar2 = std::__cxx11::string::length();
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d8,"google.protobuf.Struct.fields");
        field_name_00._M_str = in_R9;
        field_name_00._M_len = (size_t)local_d8._M_str;
        internal::WireFormatLite::VerifyUtf8String
                  (pWVar5,(char *)(ulong)uVar2,1,(Operation)local_d8._M_len,field_name_00);
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        ::const_iterator::operator++
                  ((const_iterator *)&__end4_1.super_UntypedMapIterator.bucket_index_);
      }
    }
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Struct::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Struct& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Struct)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<string, .google.protobuf.Value> fields = 1;
  if (!this_._internal_fields().empty()) {
    using MapType = ::google::protobuf::Map<std::string, ::google::protobuf::Value>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, ::google::protobuf::Value,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_MESSAGE>;
    const auto& field = this_._internal_fields();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.first.data(), static_cast<int>(entry.first.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Struct.fields");
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.first.data(), static_cast<int>(entry.first.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Struct.fields");
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Struct)
  return target;
}